

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void __thiscall
TTD::SnapShot::ReLinkThreadContextInfo
          (SnapShot *this,InflateMap *inflator,ThreadContextTTD *intoCtx)

{
  code *pcVar1;
  bool bVar2;
  SnapRootInfoEntry *pSVar3;
  RecyclableObject *obj;
  void *pvVar4;
  ScriptContext *pSVar5;
  ScriptContext *ctx;
  RecyclableObject *rootObj;
  SnapRootInfoEntry *rootEntry;
  Iterator iter;
  ThreadContextTTD *intoCtx_local;
  InflateMap *inflator_local;
  SnapShot *this_local;
  
  iter.m_currEntry = (SnapRootInfoEntry *)intoCtx;
  UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::GetIterator
            ((Iterator *)&rootEntry,&this->m_rootList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::IsValid
                      ((Iterator *)&rootEntry);
    if (!bVar2) break;
    pSVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::Current
                       ((Iterator *)&rootEntry);
    obj = InflateMap::LookupObject(inflator,pSVar3->LogObject);
    ThreadContextTTD::ForceSetRootInfoInRestore
              ((ThreadContextTTD *)iter.m_currEntry,pSVar3->LogId,obj,
               (bool)(pSVar3->MaybeLongLivedRoot & 1));
    UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Iterator::MoveNext
              ((Iterator *)&rootEntry);
  }
  if (this->m_activeScriptContext == 0) {
    pcVar1 = (code *)iter.m_currEntry[0xe].LogObject;
    pvVar4 = ThreadContextTTD::GetRuntimeHandle((ThreadContextTTD *)iter.m_currEntry);
    (*pcVar1)(pvVar4,0);
  }
  else {
    pSVar5 = InflateMap::LookupScriptContext(inflator,this->m_activeScriptContext);
    pcVar1 = (code *)iter.m_currEntry[0xe].LogObject;
    pvVar4 = ThreadContextTTD::GetRuntimeHandle((ThreadContextTTD *)iter.m_currEntry);
    (*pcVar1)(pvVar4,pSVar5);
  }
  return;
}

Assistant:

void SnapShot::ReLinkThreadContextInfo(InflateMap* inflator, ThreadContextTTD* intoCtx) const
    {
        for(auto iter = this->m_rootList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapRootInfoEntry* rootEntry = iter.Current();
            Js::RecyclableObject* rootObj = inflator->LookupObject(rootEntry->LogObject);

            intoCtx->ForceSetRootInfoInRestore(rootEntry->LogId, rootObj, rootEntry->MaybeLongLivedRoot);
        }

        if(this->m_activeScriptContext == TTD_INVALID_LOG_PTR_ID)
        {
            intoCtx->TTDExternalObjectFunctions.pfSetActiveJsRTContext(intoCtx->GetRuntimeHandle(), nullptr);
        }
        else
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(this->m_activeScriptContext);
            intoCtx->TTDExternalObjectFunctions.pfSetActiveJsRTContext(intoCtx->GetRuntimeHandle(), ctx);
        }
    }